

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O0

bool pybind11::detail::deregister_instance_impl(void *ptr,instance *self)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  internals *piVar3;
  pointer ppVar4;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> local_40;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  range;
  unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
  *registered_instances;
  instance *self_local;
  void *ptr_local;
  
  self_local = (instance *)ptr;
  piVar3 = get_internals();
  range.second.
  super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
           &piVar3->registered_instances;
  _it = std::
        unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
        ::equal_range((unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
                       *)range.second.
                         super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                         ._M_cur,&self_local);
  local_40 = it.
             super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
             ._M_cur;
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&local_40,
                       (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                        *)&range);
    if (!bVar2) {
      return false;
    }
    pPVar1 = (self->ob_base).ob_type;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                           *)&local_40);
    if (pPVar1 == (ppVar4->second->ob_base).ob_type) break;
    std::__detail::
    _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                *)&local_40);
  }
  std::
  unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
  ::erase((unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
           *)range.second.
             super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
             ._M_cur,(iterator)local_40._M_cur);
  return true;
}

Assistant:

inline bool deregister_instance_impl(void *ptr, instance *self) {
    auto &registered_instances = get_internals().registered_instances;
    auto range = registered_instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        if (Py_TYPE(self) == Py_TYPE(it->second)) {
            registered_instances.erase(it);
            return true;
        }
    }
    return false;
}